

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall
VectorLattice_MeetSingleton_Test::~VectorLattice_MeetSingleton_Test
          (VectorLattice_MeetSingleton_Test *this)

{
  VectorLattice_MeetSingleton_Test *this_local;
  
  ~VectorLattice_MeetSingleton_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VectorLattice, MeetSingleton) {
  using Vec = analysis::Vector<analysis::Bool>;
  Vec vector{analysis::Bool{}, 2};
  auto elem = vector.getTop();

  EXPECT_FALSE(vector.meet(elem, Vec::SingletonElement(1, true)));
  EXPECT_EQ(elem, (std::vector{true, true}));

  EXPECT_TRUE(vector.meet(elem, Vec::SingletonElement(0, false)));
  EXPECT_EQ(elem, (std::vector{false, true}));
}